

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O3

int xmlFileRead(void *context,char *buffer,int len)

{
  size_t sVar1;
  int iVar2;
  
  iVar2 = -1;
  if (buffer != (char *)0x0 && context != (void *)0x0) {
    sVar1 = fread(buffer,1,(long)len,(FILE *)context);
    iVar2 = (int)sVar1;
    if (iVar2 < 0) {
      __xmlIOErr(8,0,"fread()");
    }
  }
  return iVar2;
}

Assistant:

int
xmlFileRead (void * context, char * buffer, int len) {
    int ret;
    if ((context == NULL) || (buffer == NULL))
        return(-1);
    ret = fread(&buffer[0], 1,  len, (FILE *) context);
    if (ret < 0) xmlIOErr(0, "fread()");
    return(ret);
}